

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloatFormat.cpp
# Opt level: O0

string * __thiscall
tcu::FloatFormat::intervalToHex_abi_cxx11_
          (string *__return_storage_ptr__,FloatFormat *this,Interval *interval)

{
  Interval *this_00;
  bool bVar1;
  char *pcVar2;
  double dVar3;
  double dVar4;
  string local_1a8;
  string local_188;
  allocator<char> local_161;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  allocator<char> local_b9;
  Interval local_b8;
  string local_a0;
  allocator<char> local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  allocator<char> local_21;
  Interval *local_20;
  Interval *interval_local;
  FloatFormat *this_local;
  
  local_20 = interval;
  interval_local = (Interval *)this;
  this_local = (FloatFormat *)__return_storage_ptr__;
  bVar1 = Interval::empty(interval);
  if (bVar1) {
    bVar1 = Interval::hasNaN(local_20);
    pcVar2 = "{}";
    if (bVar1) {
      pcVar2 = "{ NaN }";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,pcVar2,&local_21);
    std::allocator<char>::~allocator(&local_21);
  }
  else {
    dVar3 = Interval::lo(local_20);
    dVar4 = Interval::hi(local_20);
    this_00 = local_20;
    if ((dVar3 != dVar4) || (NAN(dVar3) || NAN(dVar4))) {
      Interval::unbounded(&local_b8,true);
      bVar1 = Interval::operator==(this_00,&local_b8);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"<any>",&local_b9);
        std::allocator<char>::~allocator(&local_b9);
      }
      else {
        bVar1 = Interval::hasNaN(local_20);
        pcVar2 = "";
        if (bVar1) {
          pcVar2 = "{ NaN } | ";
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,pcVar2,&local_161);
        std::operator+(&local_140,&local_160,"[");
        dVar3 = Interval::lo(local_20);
        floatToHex_abi_cxx11_(&local_188,this,dVar3);
        std::operator+(&local_120,&local_140,&local_188);
        std::operator+(&local_100,&local_120,", ");
        dVar3 = Interval::hi(local_20);
        floatToHex_abi_cxx11_(&local_1a8,this,dVar3);
        std::operator+(&local_e0,&local_100,&local_1a8);
        std::operator+(__return_storage_ptr__,&local_e0,"]");
        std::__cxx11::string::~string((string *)&local_e0);
        std::__cxx11::string::~string((string *)&local_1a8);
        std::__cxx11::string::~string((string *)&local_100);
        std::__cxx11::string::~string((string *)&local_120);
        std::__cxx11::string::~string((string *)&local_188);
        std::__cxx11::string::~string((string *)&local_140);
        std::__cxx11::string::~string((string *)&local_160);
        std::allocator<char>::~allocator(&local_161);
      }
    }
    else {
      bVar1 = Interval::hasNaN(local_20);
      pcVar2 = "{ ";
      if (bVar1) {
        pcVar2 = "{ NaN, ";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,pcVar2,&local_79);
      dVar3 = Interval::lo(local_20);
      floatToHex_abi_cxx11_(&local_a0,this,dVar3);
      std::operator+(&local_58,&local_78,&local_a0);
      std::operator+(__return_storage_ptr__,&local_58," }");
      std::__cxx11::string::~string((string *)&local_58);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_78);
      std::allocator<char>::~allocator(&local_79);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FloatFormat::intervalToHex (const Interval& interval) const
{
	if (interval.empty())
		return interval.hasNaN() ? "{ NaN }" : "{}";

	else if (interval.lo() == interval.hi())
		return (std::string(interval.hasNaN() ? "{ NaN, " : "{ ") +
				floatToHex(interval.lo()) + " }");
	else if (interval == Interval::unbounded(true))
		return "<any>";

	return (std::string(interval.hasNaN() ? "{ NaN } | " : "") +
			"[" + floatToHex(interval.lo()) + ", " + floatToHex(interval.hi()) + "]");
}